

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void __thiscall
embree::sse42::BVHNIntersector1<4,_1,_false,_embree::sse42::SubGridIntersector1Moeller<4,_true>_>::
occluded(BVHNIntersector1<4,_1,_false,_embree::sse42::SubGridIntersector1Moeller<4,_true>_> *this,
        Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [16];
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined8 uVar6;
  Collider CVar7;
  undefined1 auVar8 [16];
  ushort uVar9;
  ushort uVar10;
  byte *pbVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  byte bVar25;
  undefined4 uVar26;
  ulong uVar27;
  ulong uVar28;
  byte bVar29;
  undefined4 uVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  long lVar41;
  int iVar42;
  int iVar43;
  float fVar44;
  uint uVar45;
  float fVar46;
  float fVar51;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar57;
  float fVar58;
  vint4 ai;
  undefined1 auVar47 [16];
  uint uVar52;
  uint uVar56;
  float fVar59;
  uint uVar60;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar61;
  byte bVar62;
  float fVar63;
  byte bVar67;
  byte bVar68;
  byte bVar70;
  float fVar71;
  byte bVar73;
  byte bVar74;
  float fVar75;
  vint4 ai_1;
  uint uVar64;
  byte bVar69;
  uint uVar72;
  uint uVar76;
  float fVar77;
  uint uVar78;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  uint uVar79;
  float fVar80;
  float fVar87;
  float fVar89;
  undefined1 auVar81 [12];
  uint uVar86;
  vint4 ai_2;
  undefined1 auVar82 [16];
  uint uVar88;
  uint uVar90;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar91;
  float fVar92;
  uint uVar93;
  float fVar98;
  float fVar100;
  vint4 ai_3;
  uint uVar99;
  uint uVar101;
  float fVar102;
  uint uVar103;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar104;
  vint4 bi_2;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar109;
  float fVar112;
  float fVar114;
  vint4 bi_3;
  undefined1 auVar110 [16];
  float fVar113;
  float fVar115;
  float fVar116;
  undefined1 auVar111 [16];
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_b64;
  Ray *local_b60;
  undefined8 local_b58;
  float fStack_b50;
  float fStack_b4c;
  ulong local_b40;
  float local_b38;
  undefined4 local_b34;
  undefined4 local_b30;
  float local_b2c;
  float local_b28;
  undefined4 local_b24;
  undefined4 local_b20;
  undefined4 local_b1c;
  undefined4 local_b18;
  int *local_b08;
  undefined8 local_b00;
  Intersectors *local_af8;
  Intersectors *local_af0;
  float *local_ae8;
  undefined4 local_ae0;
  undefined1 local_ad8 [8];
  float fStack_ad0;
  float fStack_acc;
  ulong local_ac0;
  long local_ab8;
  long local_ab0;
  undefined1 local_aa8 [8];
  float fStack_aa0;
  float fStack_a9c;
  undefined8 local_a98;
  float fStack_a90;
  float fStack_a8c;
  undefined8 local_a88;
  float fStack_a80;
  float fStack_a7c;
  undefined1 local_a78 [8];
  float fStack_a70;
  float fStack_a6c;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  float local_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  undefined8 local_a48;
  float fStack_a40;
  float fStack_a3c;
  undefined8 local_a38;
  ulong local_a30;
  ulong local_a28;
  ulong local_a20;
  ulong local_a18;
  ulong local_a10;
  ulong *local_a08;
  ulong local_a00;
  ulong local_9f8;
  ulong local_9f0;
  ulong local_9e8;
  ulong local_9e0;
  ulong local_9d8;
  long local_9d0;
  long local_9c8;
  long local_9c0;
  float local_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float local_9a8;
  float fStack_9a4;
  float fStack_9a0;
  float fStack_99c;
  float local_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float local_988;
  float fStack_984;
  float fStack_980;
  float fStack_97c;
  undefined1 local_978 [16];
  undefined1 local_968 [8];
  float fStack_960;
  float fStack_95c;
  undefined1 local_958 [8];
  float fStack_950;
  float fStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  undefined1 local_938 [8];
  float fStack_930;
  float fStack_92c;
  undefined1 local_918 [16];
  float local_908 [4];
  float local_8f8 [4];
  float local_8e8 [4];
  float local_8d8 [4];
  undefined1 local_8c8 [8];
  float fStack_8c0;
  float fStack_8bc;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined8 local_818;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_b60 = ray;
  if ((*(ulong *)(*(long *)this + 0x70) != 8) &&
     (fVar109 = *(float *)&(This->intersector1).intersect, 0.0 <= fVar109)) {
    local_a08 = local_7d0;
    local_7d8 = *(ulong *)(*(long *)this + 0x70);
    fVar80 = *(float *)&This->ptr;
    fVar87 = *(float *)((long)&This->ptr + 4);
    fVar113 = *(float *)&This->leafIntersector;
    fVar129 = *(float *)((long)&This->leafIntersector + 4);
    CVar7 = This->collider;
    auVar47._4_4_ = -(uint)(ABS(CVar7.collide._4_4_) < DAT_01f80d30._4_4_);
    auVar47._0_4_ = -(uint)(ABS(CVar7.collide._0_4_) < (float)DAT_01f80d30);
    auVar47._8_4_ = -(uint)(ABS(CVar7.name._0_4_) < DAT_01f80d30._8_4_);
    auVar47._12_4_ = -(uint)(ABS(CVar7.name._4_4_) < DAT_01f80d30._12_4_);
    auVar82 = blendvps((undefined1  [16])CVar7,_DAT_01f80d30,auVar47);
    fVar116 = 0.0;
    if (0.0 <= fVar129) {
      fVar116 = fVar129;
    }
    auVar47 = rcpps(auVar47,auVar82);
    fVar128 = auVar47._0_4_;
    local_9b8 = auVar47._4_4_;
    fVar130 = auVar47._8_4_;
    fVar128 = (1.0 - auVar82._0_4_ * fVar128) * fVar128 + fVar128;
    local_9b8 = (1.0 - auVar82._4_4_ * local_9b8) * local_9b8 + local_9b8;
    fVar130 = (1.0 - auVar82._8_4_ * fVar130) * fVar130 + fVar130;
    local_a10 = (ulong)(fVar128 < 0.0) << 4;
    local_a18 = (ulong)(local_9b8 < 0.0) << 4 | 0x20;
    local_a20 = (ulong)(fVar130 < 0.0) << 4 | 0x40;
    local_a28 = local_a10 ^ 0x10;
    local_a30 = local_a18 ^ 0x10;
    local_a38 = local_a20 ^ 0x10;
    local_9d8 = (ulong)(((uint)(fVar128 < 0.0) << 4) >> 2);
    local_9e0 = local_a28 >> 2;
    local_9e8 = local_a18 >> 2;
    local_9f0 = local_a30 >> 2;
    local_9f8 = local_a20 >> 2;
    local_a00 = local_a38 >> 2;
    local_978 = mm_lookupmask_ps._240_16_;
    local_848 = fVar109;
    fStack_844 = fVar109;
    fStack_840 = fVar109;
    fStack_83c = fVar109;
    local_858 = fVar113;
    fStack_854 = fVar113;
    fStack_850 = fVar113;
    fStack_84c = fVar113;
    local_868 = fVar116;
    fStack_864 = fVar116;
    fStack_860 = fVar116;
    fStack_85c = fVar116;
    local_878 = fVar130;
    fStack_874 = fVar130;
    fStack_870 = fVar130;
    fStack_86c = fVar130;
    local_888 = fVar80;
    fStack_884 = fVar80;
    fStack_880 = fVar80;
    fStack_87c = fVar80;
    local_898 = fVar87;
    fStack_894 = fVar87;
    fStack_890 = fVar87;
    fStack_88c = fVar87;
    local_8a8 = fVar128;
    fStack_8a4 = fVar128;
    fStack_8a0 = fVar128;
    fStack_89c = fVar128;
    fStack_9b4 = local_9b8;
    fStack_9b0 = local_9b8;
    fStack_9ac = local_9b8;
    uVar32 = local_a28;
    uVar28 = local_a10;
    uVar39 = local_a18;
    uVar36 = local_a20;
    uVar38 = local_a30;
    uVar40 = local_a38;
    fVar129 = fVar109;
    fVar138 = fVar109;
    fVar104 = fVar109;
    fVar46 = fVar116;
    fVar54 = fVar116;
    fVar58 = fVar116;
    fVar112 = fVar130;
    fVar114 = fVar130;
    fVar115 = fVar130;
    fVar89 = fVar80;
    fVar91 = fVar80;
    fVar117 = fVar80;
    fVar53 = fVar128;
    fVar57 = fVar128;
    fVar61 = fVar128;
    fVar118 = local_9b8;
    fVar119 = local_9b8;
    fVar124 = local_9b8;
    fVar125 = local_9b8;
    fVar126 = fVar113;
    fVar127 = fVar113;
    fVar131 = fVar113;
    fVar132 = fVar87;
    fVar133 = fVar87;
    fVar134 = fVar87;
LAB_0022c04d:
    do {
      uVar37 = local_a08[-1];
      local_a08 = local_a08 + -1;
      while ((uVar37 & 8) == 0) {
        pfVar5 = (float *)(uVar37 + 0x20 + uVar28);
        fVar44 = (*pfVar5 - fVar80) * fVar128;
        fVar51 = (pfVar5[1] - fVar89) * fVar53;
        fVar55 = (pfVar5[2] - fVar91) * fVar57;
        fVar59 = (pfVar5[3] - fVar117) * fVar61;
        pfVar5 = (float *)(uVar37 + 0x20 + uVar39);
        fVar63 = (*pfVar5 - fVar87) * fVar118;
        fVar71 = (pfVar5[1] - fVar132) * fVar119;
        fVar75 = (pfVar5[2] - fVar133) * fVar124;
        fVar77 = (pfVar5[3] - fVar134) * fVar125;
        uVar64 = (uint)((int)fVar63 < (int)fVar44) * (int)fVar44 |
                 (uint)((int)fVar63 >= (int)fVar44) * (int)fVar63;
        uVar72 = (uint)((int)fVar71 < (int)fVar51) * (int)fVar51 |
                 (uint)((int)fVar71 >= (int)fVar51) * (int)fVar71;
        uVar76 = (uint)((int)fVar75 < (int)fVar55) * (int)fVar55 |
                 (uint)((int)fVar75 >= (int)fVar55) * (int)fVar75;
        uVar78 = (uint)((int)fVar77 < (int)fVar59) * (int)fVar59 |
                 (uint)((int)fVar77 >= (int)fVar59) * (int)fVar77;
        pfVar5 = (float *)(uVar37 + 0x20 + uVar36);
        fVar44 = (*pfVar5 - fVar113) * fVar130;
        fVar51 = (pfVar5[1] - fVar126) * fVar112;
        fVar55 = (pfVar5[2] - fVar127) * fVar114;
        fVar59 = (pfVar5[3] - fVar131) * fVar115;
        pfVar5 = (float *)(uVar37 + 0x20 + uVar32);
        fVar63 = (*pfVar5 - fVar80) * fVar128;
        fVar71 = (pfVar5[1] - fVar89) * fVar53;
        fVar75 = (pfVar5[2] - fVar91) * fVar57;
        fVar77 = (pfVar5[3] - fVar117) * fVar61;
        pfVar5 = (float *)(uVar37 + 0x20 + uVar38);
        fVar92 = (*pfVar5 - fVar87) * fVar118;
        fVar98 = (pfVar5[1] - fVar132) * fVar119;
        fVar100 = (pfVar5[2] - fVar133) * fVar124;
        fVar102 = (pfVar5[3] - fVar134) * fVar125;
        uVar93 = (uint)((int)fVar63 < (int)fVar92) * (int)fVar63 |
                 (uint)((int)fVar63 >= (int)fVar92) * (int)fVar92;
        uVar99 = (uint)((int)fVar71 < (int)fVar98) * (int)fVar71 |
                 (uint)((int)fVar71 >= (int)fVar98) * (int)fVar98;
        uVar101 = (uint)((int)fVar75 < (int)fVar100) * (int)fVar75 |
                  (uint)((int)fVar75 >= (int)fVar100) * (int)fVar100;
        uVar103 = (uint)((int)fVar77 < (int)fVar102) * (int)fVar77 |
                  (uint)((int)fVar77 >= (int)fVar102) * (int)fVar102;
        pfVar5 = (float *)(uVar37 + 0x20 + uVar40);
        fVar63 = (*pfVar5 - fVar113) * fVar130;
        fVar71 = (pfVar5[1] - fVar126) * fVar112;
        fVar75 = (pfVar5[2] - fVar127) * fVar114;
        fVar77 = (pfVar5[3] - fVar131) * fVar115;
        uVar45 = (uint)((int)fVar44 < (int)fVar116) * (int)fVar116 |
                 (uint)((int)fVar44 >= (int)fVar116) * (int)fVar44;
        uVar52 = (uint)((int)fVar51 < (int)fVar46) * (int)fVar46 |
                 (uint)((int)fVar51 >= (int)fVar46) * (int)fVar51;
        uVar56 = (uint)((int)fVar55 < (int)fVar54) * (int)fVar54 |
                 (uint)((int)fVar55 >= (int)fVar54) * (int)fVar55;
        uVar60 = (uint)((int)fVar59 < (int)fVar58) * (int)fVar58 |
                 (uint)((int)fVar59 >= (int)fVar58) * (int)fVar59;
        uVar79 = (uint)((int)fVar109 < (int)fVar63) * (int)fVar109 |
                 (uint)((int)fVar109 >= (int)fVar63) * (int)fVar63;
        uVar86 = (uint)((int)fVar129 < (int)fVar71) * (int)fVar129 |
                 (uint)((int)fVar129 >= (int)fVar71) * (int)fVar71;
        uVar88 = (uint)((int)fVar138 < (int)fVar75) * (int)fVar138 |
                 (uint)((int)fVar138 >= (int)fVar75) * (int)fVar75;
        uVar90 = (uint)((int)fVar104 < (int)fVar77) * (int)fVar104 |
                 (uint)((int)fVar104 >= (int)fVar77) * (int)fVar77;
        auVar82._0_4_ =
             -(uint)((int)(((int)uVar93 < (int)uVar79) * uVar93 |
                          ((int)uVar93 >= (int)uVar79) * uVar79) <
                    (int)(((int)uVar45 < (int)uVar64) * uVar64 |
                         ((int)uVar45 >= (int)uVar64) * uVar45));
        auVar82._4_4_ =
             -(uint)((int)(((int)uVar99 < (int)uVar86) * uVar99 |
                          ((int)uVar99 >= (int)uVar86) * uVar86) <
                    (int)(((int)uVar52 < (int)uVar72) * uVar72 |
                         ((int)uVar52 >= (int)uVar72) * uVar52));
        auVar82._8_4_ =
             -(uint)((int)(((int)uVar101 < (int)uVar88) * uVar101 |
                          ((int)uVar101 >= (int)uVar88) * uVar88) <
                    (int)(((int)uVar56 < (int)uVar76) * uVar76 |
                         ((int)uVar56 >= (int)uVar76) * uVar56));
        auVar82._12_4_ =
             -(uint)((int)(((int)uVar103 < (int)uVar90) * uVar103 |
                          ((int)uVar103 >= (int)uVar90) * uVar90) <
                    (int)(((int)uVar60 < (int)uVar78) * uVar78 |
                         ((int)uVar60 >= (int)uVar78) * uVar60));
        uVar45 = movmskps((int)context,auVar82);
        context = (RayQueryContext *)(ulong)uVar45;
        if (uVar45 == 0xf) {
          if (local_a08 == &local_7d8) {
            return;
          }
          goto LAB_0022c04d;
        }
        bVar29 = (byte)uVar45 ^ 0xf;
        context = (RayQueryContext *)(ulong)bVar29;
        uVar27 = uVar37 & 0xfffffffffffffff0;
        lVar31 = 0;
        if ((Intersectors *)context != (Intersectors *)0x0) {
          for (; (bVar29 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
          }
        }
        uVar37 = *(ulong *)(uVar27 + lVar31 * 8);
        uVar45 = bVar29 - 1 & (uint)bVar29;
        if (uVar45 != 0) {
          *local_a08 = uVar37;
          local_a08 = local_a08 + 1;
          lVar31 = 0;
          if (uVar45 != 0) {
            for (; (uVar45 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
            }
          }
          uVar37 = *(ulong *)(uVar27 + lVar31 * 8);
          uVar45 = uVar45 - 1 & uVar45;
          context = (RayQueryContext *)(ulong)uVar45;
          if (uVar45 != 0) {
            do {
              *local_a08 = uVar37;
              local_a08 = local_a08 + 1;
              lVar31 = 0;
              if ((Intersectors *)context != (Intersectors *)0x0) {
                for (; ((ulong)context >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                }
              }
              uVar37 = *(ulong *)(uVar27 + lVar31 * 8);
              context = (RayQueryContext *)
                        ((ulong)context &
                        (ulong)((long)&(((Intersectors *)((long)context + -0x118))->
                                       intersector16_nofilter).name + 7U));
            } while ((Intersectors *)context != (Intersectors *)0x0);
          }
        }
      }
      local_9d0 = (ulong)((uint)uVar37 & 0xf) - 8;
      if (local_9d0 != 0) {
        uVar37 = uVar37 & 0xfffffffffffffff0;
        local_9c8 = 0;
        do {
          lVar31 = local_9c8 * 0x58;
          local_9c0 = uVar37 + lVar31;
          uVar32 = *(ulong *)(uVar37 + 0x20 + lVar31);
          auVar48._8_8_ = 0;
          auVar48._0_8_ = uVar32;
          uVar6 = *(undefined8 *)(uVar37 + 0x24 + lVar31);
          bVar29 = (byte)uVar32;
          bVar62 = (byte)uVar6;
          bVar15 = (byte)(uVar32 >> 8);
          bVar67 = (byte)((ulong)uVar6 >> 8);
          bVar16 = (byte)(uVar32 >> 0x10);
          bVar68 = (byte)((ulong)uVar6 >> 0x10);
          bVar17 = (byte)(uVar32 >> 0x18);
          bVar69 = (byte)((ulong)uVar6 >> 0x18);
          bVar18 = (byte)(uVar32 >> 0x20);
          bVar70 = (byte)((ulong)uVar6 >> 0x20);
          bVar19 = (byte)(uVar32 >> 0x28);
          bVar73 = (byte)((ulong)uVar6 >> 0x28);
          bVar20 = (byte)(uVar32 >> 0x30);
          bVar74 = (byte)((ulong)uVar6 >> 0x30);
          bVar25 = (byte)((ulong)uVar6 >> 0x38);
          bVar21 = (byte)(uVar32 >> 0x38);
          auVar65[0] = -((byte)((bVar29 < bVar62) * bVar29 | (bVar29 >= bVar62) * bVar62) == bVar29)
          ;
          auVar65[1] = -((byte)((bVar15 < bVar67) * bVar15 | (bVar15 >= bVar67) * bVar67) == bVar15)
          ;
          auVar65[2] = -((byte)((bVar16 < bVar68) * bVar16 | (bVar16 >= bVar68) * bVar68) == bVar16)
          ;
          auVar65[3] = -((byte)((bVar17 < bVar69) * bVar17 | (bVar17 >= bVar69) * bVar69) == bVar17)
          ;
          auVar65[4] = -((byte)((bVar18 < bVar70) * bVar18 | (bVar18 >= bVar70) * bVar70) == bVar18)
          ;
          auVar65[5] = -((byte)((bVar19 < bVar73) * bVar19 | (bVar19 >= bVar73) * bVar73) == bVar19)
          ;
          auVar65[6] = -((byte)((bVar20 < bVar74) * bVar20 | (bVar20 >= bVar74) * bVar74) == bVar20)
          ;
          auVar65[7] = -((byte)((bVar21 < bVar25) * bVar21 | (bVar21 >= bVar25) * bVar25) == bVar21)
          ;
          auVar65[8] = 0xff;
          auVar65[9] = 0xff;
          auVar65[10] = 0xff;
          auVar65[0xb] = 0xff;
          auVar65[0xc] = 0xff;
          auVar65[0xd] = 0xff;
          auVar65[0xe] = 0xff;
          auVar65[0xf] = 0xff;
          auVar83._8_4_ = 0xffffffff;
          auVar83._0_8_ = 0xffffffffffffffff;
          auVar83._12_4_ = 0xffffffff;
          auVar47 = pmovzxbd(auVar48,auVar65 ^ auVar83);
          auVar47 = auVar47 ^ auVar83;
          auVar85._0_4_ = auVar47._0_4_ << 0x1f;
          auVar85._4_4_ = auVar47._4_4_ << 0x1f;
          auVar85._8_4_ = auVar47._8_4_ << 0x1f;
          auVar85._12_4_ = auVar47._12_4_ << 0x1f;
          uVar26 = movmskps((int)local_9c8,auVar85);
          fVar118 = *(float *)(uVar37 + 0x38 + lVar31);
          fVar119 = *(float *)(uVar37 + 0x3c + lVar31);
          fVar124 = *(float *)(uVar37 + 0x44 + lVar31);
          auVar49._8_8_ = 0;
          auVar49._0_8_ = *(ulong *)(local_9d8 + 0x20 + local_9c0);
          auVar47 = pmovzxbd(auVar49,auVar49);
          auVar50._8_8_ = 0;
          auVar50._0_8_ = *(ulong *)(local_9e0 + 0x20 + local_9c0);
          auVar82 = pmovzxbd(auVar50,auVar50);
          fVar125 = *(float *)(uVar37 + 0x48 + lVar31);
          auVar66._8_8_ = 0;
          auVar66._0_8_ = *(ulong *)(local_9e8 + 0x20 + local_9c0);
          auVar48 = pmovzxbd(auVar66,auVar66);
          auVar84._8_8_ = 0;
          auVar84._0_8_ = *(ulong *)(local_9f0 + 0x20 + local_9c0);
          auVar85 = pmovzxbd(auVar84,auVar84);
          fVar44 = *(float *)(uVar37 + 0x4c + lVar31);
          auVar105._8_8_ = 0;
          auVar105._0_8_ = *(ulong *)(local_9f8 + 0x20 + local_9c0);
          auVar49 = pmovzxbd(auVar105,auVar105);
          auVar110._8_8_ = 0;
          auVar110._0_8_ = *(ulong *)(local_a00 + 0x20 + local_9c0);
          auVar50 = pmovzxbd(auVar110,auVar110);
          fVar51 = *(float *)(uVar37 + 0x40 + lVar31);
          fVar75 = (((float)auVar47._0_4_ * fVar124 + fVar118) - fVar80) * fVar128;
          fVar77 = (((float)auVar47._4_4_ * fVar124 + fVar118) - fVar89) * fVar53;
          fVar92 = (((float)auVar47._8_4_ * fVar124 + fVar118) - fVar91) * fVar57;
          fVar98 = (((float)auVar47._12_4_ * fVar124 + fVar118) - fVar117) * fVar61;
          fVar55 = (((float)auVar48._0_4_ * fVar125 + fVar119) - fVar87) * local_9b8;
          fVar59 = (((float)auVar48._4_4_ * fVar125 + fVar119) - fVar132) * fStack_9b4;
          fVar63 = (((float)auVar48._8_4_ * fVar125 + fVar119) - fVar133) * fStack_9b0;
          fVar71 = (((float)auVar48._12_4_ * fVar125 + fVar119) - fVar134) * fStack_9ac;
          uVar45 = (uint)((int)fVar55 < (int)fVar75) * (int)fVar75 |
                   (uint)((int)fVar55 >= (int)fVar75) * (int)fVar55;
          uVar52 = (uint)((int)fVar59 < (int)fVar77) * (int)fVar77 |
                   (uint)((int)fVar59 >= (int)fVar77) * (int)fVar59;
          uVar56 = (uint)((int)fVar63 < (int)fVar92) * (int)fVar92 |
                   (uint)((int)fVar63 >= (int)fVar92) * (int)fVar63;
          uVar60 = (uint)((int)fVar71 < (int)fVar98) * (int)fVar98 |
                   (uint)((int)fVar71 >= (int)fVar98) * (int)fVar71;
          fVar128 = (((float)auVar82._0_4_ * fVar124 + fVar118) - fVar80) * fVar128;
          fVar53 = (((float)auVar82._4_4_ * fVar124 + fVar118) - fVar89) * fVar53;
          fVar57 = (((float)auVar82._8_4_ * fVar124 + fVar118) - fVar91) * fVar57;
          fVar61 = (((float)auVar82._12_4_ * fVar124 + fVar118) - fVar117) * fVar61;
          fVar80 = (((float)auVar85._0_4_ * fVar125 + fVar119) - fVar87) * local_9b8;
          fVar87 = (((float)auVar85._4_4_ * fVar125 + fVar119) - fVar132) * fStack_9b4;
          fVar89 = (((float)auVar85._8_4_ * fVar125 + fVar119) - fVar133) * fStack_9b0;
          fVar91 = (((float)auVar85._12_4_ * fVar125 + fVar119) - fVar134) * fStack_9ac;
          uVar64 = (uint)((int)fVar128 < (int)fVar80) * (int)fVar128 |
                   (uint)((int)fVar128 >= (int)fVar80) * (int)fVar80;
          uVar72 = (uint)((int)fVar53 < (int)fVar87) * (int)fVar53 |
                   (uint)((int)fVar53 >= (int)fVar87) * (int)fVar87;
          uVar76 = (uint)((int)fVar57 < (int)fVar89) * (int)fVar57 |
                   (uint)((int)fVar57 >= (int)fVar89) * (int)fVar89;
          uVar78 = (uint)((int)fVar61 < (int)fVar91) * (int)fVar61 |
                   (uint)((int)fVar61 >= (int)fVar91) * (int)fVar91;
          fVar80 = (((float)auVar49._0_4_ * fVar44 + fVar51) - fVar113) * fVar130;
          fVar87 = (((float)auVar49._4_4_ * fVar44 + fVar51) - fVar126) * fVar112;
          fVar89 = (((float)auVar49._8_4_ * fVar44 + fVar51) - fVar127) * fVar114;
          fVar91 = (((float)auVar49._12_4_ * fVar44 + fVar51) - fVar131) * fVar115;
          uVar79 = (uint)((int)fVar80 < (int)fVar116) * (int)fVar116 |
                   (uint)((int)fVar80 >= (int)fVar116) * (int)fVar80;
          uVar86 = (uint)((int)fVar87 < (int)fVar46) * (int)fVar46 |
                   (uint)((int)fVar87 >= (int)fVar46) * (int)fVar87;
          uVar88 = (uint)((int)fVar89 < (int)fVar54) * (int)fVar54 |
                   (uint)((int)fVar89 >= (int)fVar54) * (int)fVar89;
          uVar90 = (uint)((int)fVar91 < (int)fVar58) * (int)fVar58 |
                   (uint)((int)fVar91 >= (int)fVar58) * (int)fVar91;
          fVar130 = (((float)auVar50._0_4_ * fVar44 + fVar51) - fVar113) * fVar130;
          fVar112 = (((float)auVar50._4_4_ * fVar44 + fVar51) - fVar126) * fVar112;
          fVar114 = (((float)auVar50._8_4_ * fVar44 + fVar51) - fVar127) * fVar114;
          fVar115 = (((float)auVar50._12_4_ * fVar44 + fVar51) - fVar131) * fVar115;
          uVar93 = (uint)((int)fVar109 < (int)fVar130) * (int)fVar109 |
                   (uint)((int)fVar109 >= (int)fVar130) * (int)fVar130;
          uVar99 = (uint)((int)fVar129 < (int)fVar112) * (int)fVar129 |
                   (uint)((int)fVar129 >= (int)fVar112) * (int)fVar112;
          uVar101 = (uint)((int)fVar138 < (int)fVar114) * (int)fVar138 |
                    (uint)((int)fVar138 >= (int)fVar114) * (int)fVar114;
          uVar103 = (uint)((int)fVar104 < (int)fVar115) * (int)fVar104 |
                    (uint)((int)fVar104 >= (int)fVar115) * (int)fVar115;
          auVar106._0_4_ =
               -(uint)((int)(((int)uVar64 < (int)uVar93) * uVar64 |
                            ((int)uVar64 >= (int)uVar93) * uVar93) <
                      (int)(((int)uVar79 < (int)uVar45) * uVar45 |
                           ((int)uVar79 >= (int)uVar45) * uVar79));
          auVar106._4_4_ =
               -(uint)((int)(((int)uVar72 < (int)uVar99) * uVar72 |
                            ((int)uVar72 >= (int)uVar99) * uVar99) <
                      (int)(((int)uVar86 < (int)uVar52) * uVar52 |
                           ((int)uVar86 >= (int)uVar52) * uVar86));
          auVar106._8_4_ =
               -(uint)((int)(((int)uVar76 < (int)uVar101) * uVar76 |
                            ((int)uVar76 >= (int)uVar101) * uVar101) <
                      (int)(((int)uVar88 < (int)uVar56) * uVar56 |
                           ((int)uVar88 >= (int)uVar56) * uVar88));
          auVar106._12_4_ =
               -(uint)((int)(((int)uVar78 < (int)uVar103) * uVar78 |
                            ((int)uVar78 >= (int)uVar103) * uVar103) <
                      (int)(((int)uVar90 < (int)uVar60) * uVar60 |
                           ((int)uVar90 >= (int)uVar60) * uVar90));
          uVar30 = movmskps((int)lVar31,auVar106);
          bVar29 = ~(byte)uVar30 & (byte)uVar26;
          context = (RayQueryContext *)(ulong)CONCAT31((int3)((uint)uVar30 >> 8),bVar29);
          if (bVar29 != 0) {
            uVar32 = (ulong)bVar29;
            do {
              lVar31 = 0;
              if (uVar32 != 0) {
                for (; (uVar32 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                }
              }
              uVar9 = *(ushort *)(local_9c0 + lVar31 * 8);
              uVar10 = *(ushort *)(local_9c0 + 2 + lVar31 * 8);
              local_b40 = (ulong)*(uint *)(local_9c0 + 0x50);
              local_ac0 = (ulong)*(uint *)(local_9c0 + 4 + lVar31 * 8);
              local_ab0 = *(long *)&(local_b60->org).field_0;
              lVar31 = *(long *)(*(long *)(local_ab0 + 0x1e8) + local_b40 * 8);
              local_ab8 = *(long *)(lVar31 + 0x58);
              uVar28 = *(ulong *)(lVar31 + 0x90);
              lVar33 = local_ac0 * *(long *)(lVar31 + 0x68);
              uVar52 = uVar9 & 0x7fff;
              context = (RayQueryContext *)(ulong)uVar52;
              uVar56 = uVar10 & 0x7fff;
              uVar45 = *(uint *)(local_ab8 + 4 + lVar33);
              uVar38 = (ulong)uVar45;
              uVar36 = (ulong)(uVar45 * uVar56 + *(int *)(local_ab8 + lVar33) + uVar52);
              lVar31 = *(long *)(lVar31 + 0xa0);
              pfVar5 = (float *)(uVar28 + lVar31 * uVar36);
              fVar109 = *pfVar5;
              fVar80 = pfVar5[1];
              fVar87 = pfVar5[2];
              pfVar5 = (float *)(uVar28 + (uVar36 + 1) * lVar31);
              fVar113 = *pfVar5;
              local_7e8 = pfVar5[1];
              fVar129 = pfVar5[2];
              pfVar5 = (float *)(uVar28 + (uVar36 + uVar38) * lVar31);
              fVar116 = *pfVar5;
              fVar138 = pfVar5[1];
              local_a58 = pfVar5[2];
              lVar41 = uVar36 + uVar38 + 1;
              pauVar1 = (undefined1 (*) [16])(uVar28 + lVar41 * lVar31);
              fVar104 = *(float *)*pauVar1;
              fStack_7dc = *(float *)(*pauVar1 + 4);
              fStack_a54 = *(float *)(*pauVar1 + 8);
              uVar39 = (ulong)(-1 < (short)uVar9);
              pfVar5 = (float *)(uVar28 + (uVar36 + uVar39 + 1) * lVar31);
              lVar35 = uVar39 + lVar41;
              pfVar2 = (float *)(uVar28 + lVar35 * lVar31);
              fStack_a64 = pfVar2[1];
              fStack_a60 = pfVar2[2];
              uVar39 = 0;
              if (-1 < (short)uVar10) {
                uVar39 = uVar38;
              }
              pfVar3 = (float *)(uVar28 + (uVar36 + uVar38 + uVar39) * lVar31);
              pfVar4 = (float *)(uVar28 + (lVar41 + uVar39) * lVar31);
              local_7f8 = *pfVar4;
              fStack_7f4 = pfVar4[1];
              fStack_7f0 = pfVar4[2];
              local_a68 = *pfVar2;
              fStack_a5c = pfVar2[3];
              fStack_7ec = pfVar4[3];
              _local_ad8 = *pauVar1;
              auVar82 = _local_ad8;
              _local_ad8 = SUB1612(*pauVar1,0);
              fStack_7e4 = pfVar5[1];
              fStack_7e0 = fStack_a64;
              fVar46 = fVar80 - local_7e8;
              fVar54 = local_7e8 - pfVar5[1];
              fVar58 = fStack_7dc - fStack_a64;
              fVar130 = fVar138 - fStack_7dc;
              local_a48 = CONCAT44(pfVar5[2],fVar129);
              local_a38 = CONCAT44(fStack_a54,fStack_a60);
              fVar140 = fVar87 - fVar129;
              fVar142 = fVar129 - pfVar5[2];
              fVar144 = fStack_a54 - fStack_a60;
              fVar146 = local_a58 - fStack_a54;
              fStack_800 = fStack_7f4;
              fStack_7fc = pfVar3[1];
              fVar133 = fVar138 - fVar80;
              fVar134 = fStack_7dc - local_7e8;
              fVar44 = fStack_7f4 - fStack_7dc;
              fVar51 = pfVar3[1] - fVar138;
              fStack_a50 = fStack_7f0;
              fStack_a4c = pfVar3[2];
              fVar75 = local_a58 - fVar87;
              fVar77 = fStack_a54 - fVar129;
              fVar92 = fStack_7f0 - fStack_a54;
              fVar98 = pfVar3[2] - local_a58;
              local_8d8[0] = fVar140 * fVar133 - fVar46 * fVar75;
              local_8d8[1] = fVar142 * fVar134 - fVar54 * fVar77;
              local_8d8[2] = fVar144 * fVar44 - fVar58 * fVar92;
              local_8d8[3] = fVar146 * fVar51 - fVar130 * fVar98;
              local_818 = CONCAT44(fVar104,fVar116);
              local_808 = local_7f8;
              fStack_804 = *pfVar3;
              fVar57 = fVar116 - fVar109;
              fVar61 = fVar104 - fVar113;
              fVar118 = local_7f8 - fVar104;
              fVar119 = *pfVar3 - fVar116;
              local_988 = *(float *)&This->ptr;
              local_998 = *(float *)((long)&This->ptr + 4);
              local_aa8._4_4_ = *(undefined4 *)&This->leafIntersector;
              local_a98._0_4_ = *(float *)&(This->collider).collide;
              local_9a8 = *(float *)((long)&(This->collider).collide + 4);
              local_b58._0_4_ = *(float *)&(This->collider).name;
              fStack_984 = local_988;
              fStack_980 = local_988;
              fStack_97c = local_988;
              local_a78._0_4_ = fVar109 - local_988;
              local_a78._4_4_ = fVar113 - local_988;
              fStack_a70 = fVar104 - local_988;
              fStack_a6c = fVar116 - local_988;
              fStack_994 = local_998;
              fStack_990 = local_998;
              fStack_98c = local_998;
              fVar80 = fVar80 - local_998;
              fVar102 = local_7e8 - local_998;
              fVar136 = fStack_7dc - local_998;
              fVar138 = fVar138 - local_998;
              fVar124 = (float)local_a78._0_4_ * local_9a8 - fVar80 * (float)local_a98;
              fVar125 = (float)local_a78._4_4_ * local_9a8 - fVar102 * (float)local_a98;
              fVar126 = fStack_a70 * local_9a8 - fVar136 * (float)local_a98;
              fVar127 = fStack_a6c * local_9a8 - fVar138 * (float)local_a98;
              local_a88 = CONCAT44(*pfVar5,fVar113);
              fVar109 = fVar109 - fVar113;
              fVar113 = fVar113 - *pfVar5;
              fVar89 = fVar104 - *pfVar2;
              fVar116 = fVar116 - fVar104;
              fVar104 = fVar109 * fVar75 - fVar140 * fVar57;
              fVar112 = fVar113 * fVar77 - fVar142 * fVar61;
              local_8c8._4_4_ = fVar112;
              local_8c8._0_4_ = fVar104;
              fVar114 = fVar89 * fVar92 - fVar144 * fVar118;
              fVar115 = fVar116 * fVar98 - fVar146 * fVar119;
              local_aa8._0_4_ = local_aa8._4_4_;
              fStack_aa0 = (float)local_aa8._4_4_;
              fStack_a9c = (float)local_aa8._4_4_;
              fVar87 = fVar87 - (float)local_aa8._4_4_;
              fVar129 = fVar129 - (float)local_aa8._4_4_;
              fVar131 = fStack_a54 - (float)local_aa8._4_4_;
              fVar132 = local_a58 - (float)local_aa8._4_4_;
              fVar91 = fVar87 * (float)local_a98 - (float)local_a78._0_4_ * (float)local_b58;
              fVar117 = fVar129 * (float)local_a98 - (float)local_a78._4_4_ * (float)local_b58;
              fVar128 = fVar131 * (float)local_a98 - fStack_a70 * (float)local_b58;
              fVar53 = fVar132 * (float)local_a98 - fStack_a6c * (float)local_b58;
              fVar141 = fVar46 * fVar57 - fVar109 * fVar133;
              fVar143 = fVar54 * fVar61 - fVar113 * fVar134;
              fVar145 = fVar58 * fVar118 - fVar89 * fVar44;
              fVar147 = fVar130 * fVar119 - fVar116 * fVar51;
              fVar100 = fVar80 * (float)local_b58 - fVar87 * local_9a8;
              fVar135 = fVar102 * (float)local_b58 - fVar129 * local_9a8;
              fVar137 = fVar136 * (float)local_b58 - fVar131 * local_9a8;
              fVar139 = fVar138 * (float)local_b58 - fVar132 * local_9a8;
              local_b58._4_4_ = (float)local_b58;
              fStack_b50 = (float)local_b58;
              fStack_b4c = (float)local_b58;
              fStack_8c0 = fVar114;
              fStack_8bc = fVar115;
              fStack_9a4 = local_9a8;
              fStack_9a0 = local_9a8;
              fStack_99c = local_9a8;
              local_a98._4_4_ = (float)local_a98;
              fStack_a90 = (float)local_a98;
              fStack_a8c = (float)local_a98;
              fVar55 = local_8d8[0] * (float)local_a98 +
                       fVar104 * local_9a8 + fVar141 * (float)local_b58;
              fVar59 = local_8d8[1] * (float)local_a98 +
                       fVar112 * local_9a8 + fVar143 * (float)local_b58;
              fVar63 = local_8d8[2] * (float)local_a98 +
                       fVar114 * local_9a8 + fVar145 * (float)local_b58;
              fVar71 = local_8d8[3] * (float)local_a98 +
                       fVar115 * local_9a8 + fVar147 * (float)local_b58;
              uVar76 = (uint)fVar55 & 0x80000000;
              uVar78 = (uint)fVar59 & 0x80000000;
              uVar79 = (uint)fVar63 & 0x80000000;
              uVar86 = (uint)fVar71 & 0x80000000;
              fVar57 = (float)((uint)(fVar57 * fVar100 + fVar133 * fVar91 + fVar75 * fVar124) ^
                              uVar76);
              fVar61 = (float)((uint)(fVar61 * fVar135 + fVar134 * fVar117 + fVar77 * fVar125) ^
                              uVar78);
              fVar118 = (float)((uint)(fVar118 * fVar137 + fVar44 * fVar128 + fVar92 * fVar126) ^
                               uVar79);
              fVar119 = (float)((uint)(fVar119 * fVar139 + fVar51 * fVar53 + fVar98 * fVar127) ^
                               uVar86);
              fVar109 = (float)((uint)(fVar100 * fVar109 + fVar91 * fVar46 + fVar124 * fVar140) ^
                               uVar76);
              fVar113 = (float)((uint)(fVar135 * fVar113 + fVar117 * fVar54 + fVar125 * fVar142) ^
                               uVar78);
              fVar46 = (float)((uint)(fVar137 * fVar89 + fVar128 * fVar58 + fVar126 * fVar144) ^
                              uVar79);
              fVar116 = (float)((uint)(fVar139 * fVar116 + fVar53 * fVar130 + fVar127 * fVar146) ^
                               uVar86);
              local_938._0_4_ = ABS(fVar55);
              local_938._4_4_ = ABS(fVar59);
              fStack_930 = ABS(fVar63);
              fStack_92c = ABS(fVar71);
              uVar45 = -(uint)((0.0 <= fVar109 && 0.0 <= fVar57) && fVar55 != 0.0) & local_978._0_4_
                       & -(uint)(fVar57 + fVar109 <= (float)local_938._0_4_);
              uVar60 = -(uint)((0.0 <= fVar113 && 0.0 <= fVar61) && fVar59 != 0.0) & local_978._4_4_
                       & -(uint)(fVar61 + fVar113 <= (float)local_938._4_4_);
              uVar64 = -(uint)((0.0 <= fVar46 && 0.0 <= fVar118) && fVar63 != 0.0) & local_978._8_4_
                       & -(uint)(fVar118 + fVar46 <= fStack_930);
              uVar72 = -(uint)((0.0 <= fVar116 && 0.0 <= fVar119) && fVar71 != 0.0) &
                       local_978._12_4_ & -(uint)(fVar119 + fVar116 <= fStack_92c);
              auVar22._4_4_ = uVar60;
              auVar22._0_4_ = uVar45;
              auVar22._8_4_ = uVar64;
              auVar22._12_4_ = uVar72;
              iVar34 = movmskps((int)lVar35,auVar22);
              auVar47 = *(undefined1 (*) [16])(uVar28 + (uVar39 + lVar35) * lVar31);
              auVar81 = auVar47._0_12_;
              local_828 = ZEXT416(uVar52);
              local_838 = ZEXT416(uVar56);
              if (iVar34 != 0) {
                auVar120._0_4_ = fVar80 * fVar104 + fVar87 * fVar141;
                auVar120._4_4_ = fVar102 * fVar112 + fVar129 * fVar143;
                auVar120._8_4_ = fVar136 * fVar114 + fVar131 * fVar145;
                auVar120._12_4_ = fVar138 * fVar115 + fVar132 * fVar147;
                local_948 = (float)(uVar76 ^ (uint)((float)local_a78._0_4_ * local_8d8[0] +
                                                   auVar120._0_4_));
                fStack_944 = (float)(uVar78 ^ (uint)((float)local_a78._4_4_ * local_8d8[1] +
                                                    auVar120._4_4_));
                fStack_940 = (float)(uVar79 ^ (uint)(fStack_a70 * local_8d8[2] + auVar120._8_4_));
                fStack_93c = (float)(uVar86 ^ (uint)(fStack_a6c * local_8d8[3] + auVar120._12_4_));
                fVar80 = *(float *)((long)&This->leafIntersector + 4);
                bVar12 = fVar80 * (float)local_938._4_4_ < fStack_944;
                iVar34 = -(uint)bVar12;
                bVar13 = fVar80 * fStack_930 < fStack_940;
                iVar42 = -(uint)bVar13;
                bVar14 = fVar80 * fStack_92c < fStack_93c;
                iVar43 = -(uint)bVar14;
                auVar95._8_4_ = iVar42;
                auVar95._4_4_ = iVar34;
                auVar95._12_4_ = iVar43;
                auVar8._0_8_ = (This->intersector1).intersect;
                auVar8._8_8_ = (This->intersector1).occluded;
                fVar87 = (float)auVar8._0_8_;
                local_918._0_4_ =
                     -(uint)(local_948 <= fVar87 * (float)local_938._0_4_ &&
                            fVar80 * (float)local_938._0_4_ < local_948) & uVar45;
                local_918._4_4_ =
                     -(uint)(fStack_944 <= fVar87 * (float)local_938._4_4_ && bVar12) & uVar60;
                local_918._8_4_ = -(uint)(fStack_940 <= fVar87 * fStack_930 && bVar13) & uVar64;
                local_918._12_4_ = -(uint)(fStack_93c <= fVar87 * fStack_92c && bVar14) & uVar72;
                uVar45 = movmskps((int)uVar28,local_918);
                uVar28 = (ulong)uVar45;
                if (uVar45 != 0) {
                  context = (RayQueryContext *)extractps(auVar8,1);
                  local_8b8 = CONCAT44(fVar143,fVar141);
                  uStack_8b0 = CONCAT44(fVar147,fVar145);
                  auVar95._0_4_ = (float)(int)(*(ushort *)(local_ab8 + 8 + lVar33) - 1);
                  auVar111._4_4_ = iVar34;
                  auVar111._0_4_ = auVar95._0_4_;
                  auVar111._8_4_ = iVar42;
                  auVar111._12_4_ = iVar43;
                  auVar48 = rcpss(auVar111,auVar95);
                  auVar121._4_12_ = auVar120._4_12_;
                  auVar121._0_4_ = (float)(int)(*(ushort *)(local_ab8 + 10 + lVar33) - 1);
                  fStack_95c = (2.0 - auVar95._0_4_ * auVar48._0_4_) * auVar48._0_4_;
                  auVar96._4_4_ = auVar120._4_4_;
                  auVar96._0_4_ = auVar121._0_4_;
                  auVar96._8_4_ = auVar120._8_4_;
                  auVar96._12_4_ = auVar120._12_4_;
                  auVar48 = rcpss(auVar96,auVar121);
                  fStack_94c = (2.0 - auVar121._0_4_ * auVar48._0_4_) * auVar48._0_4_;
                  local_968._0_4_ = fStack_95c * ((float)uVar52 * (float)local_938._0_4_ + fVar57);
                  local_968._4_4_ =
                       fStack_95c * ((float)(uVar52 + 1) * (float)local_938._4_4_ + fVar61);
                  fStack_960 = fStack_95c * ((float)(uVar52 + 1) * fStack_930 + fVar118);
                  fStack_95c = fStack_95c * ((float)uVar52 * fStack_92c + fVar119);
                  local_958._0_4_ = fStack_94c * ((float)uVar56 * (float)local_938._0_4_ + fVar109);
                  local_958._4_4_ = fStack_94c * ((float)uVar56 * (float)local_938._4_4_ + fVar113);
                  fStack_950 = fStack_94c * ((float)(uVar56 + 1) * fStack_930 + fVar46);
                  fStack_94c = fStack_94c * ((float)(uVar56 + 1) * fStack_92c + fVar116);
                  lVar31 = *(long *)(*(long *)(local_ab0 + 0x1e8) + local_b40 * 8);
                  if ((*(uint *)(lVar31 + 0x34) & (uint)context) != 0) {
                    pbVar11 = *(byte **)&(local_b60->dir).field_0;
                    if ((*(long *)(pbVar11 + 0x10) == 0) && (*(long *)(lVar31 + 0x48) == 0))
                    goto LAB_0022d069;
                    _local_aa8 = auVar8;
                    _local_a78 = auVar47;
                    auVar24._4_4_ = local_938._4_4_;
                    auVar24._0_4_ = local_938._0_4_;
                    auVar24._8_4_ = fStack_930;
                    auVar24._12_4_ = fStack_92c;
                    auVar47 = rcpps(_local_8c8,auVar24);
                    fVar109 = auVar47._0_4_;
                    fVar80 = auVar47._4_4_;
                    fVar87 = auVar47._8_4_;
                    fVar113 = auVar47._12_4_;
                    fVar109 = (1.0 - (float)local_938._0_4_ * fVar109) * fVar109 + fVar109;
                    fVar80 = (1.0 - (float)local_938._4_4_ * fVar80) * fVar80 + fVar80;
                    fVar87 = (1.0 - fStack_930 * fVar87) * fVar87 + fVar87;
                    fVar113 = (1.0 - fStack_92c * fVar113) * fVar113 + fVar113;
                    local_8e8[0] = local_948 * fVar109;
                    local_8e8[1] = fStack_944 * fVar80;
                    local_8e8[2] = fStack_940 * fVar87;
                    local_8e8[3] = fStack_93c * fVar113;
                    local_908[0] = (float)local_968._0_4_ * fVar109;
                    local_908[1] = (float)local_968._4_4_ * fVar80;
                    local_908[2] = fStack_960 * fVar87;
                    local_908[3] = fStack_95c * fVar113;
                    local_8f8[0] = (float)local_958._0_4_ * fVar109;
                    local_8f8[1] = (float)local_958._4_4_ * fVar80;
                    local_8f8[2] = fStack_950 * fVar87;
                    local_8f8[3] = fStack_94c * fVar113;
                    uVar39 = (ulong)(byte)uVar45;
                    local_b58 = (Intersectors *)0x0;
                    if (uVar39 != 0) {
                      for (; ((byte)uVar45 >> (long)local_b58 & 1) == 0;
                          local_b58 = (Intersectors *)((long)local_b58 + 1)) {
                      }
                    }
                    local_a98 = *(undefined4 **)((long)&(local_b60->org).field_0 + 8);
                    _local_ad8 = auVar82;
                    do {
                      local_b2c = local_908[(long)local_b58];
                      local_b28 = local_8f8[(long)local_b58];
                      *(float *)&(This->intersector1).intersect = local_8e8[(long)local_b58];
                      local_b38 = local_8d8[(long)local_b58];
                      local_b34 = *(undefined4 *)(local_8c8 + (long)local_b58 * 4);
                      local_b30 = *(undefined4 *)((long)&local_8b8 + (long)local_b58 * 4);
                      local_b24 = (undefined4)local_ac0;
                      local_b20 = (undefined4)local_b40;
                      local_b1c = *local_a98;
                      local_b18 = local_a98[1];
                      local_b64 = -1;
                      local_b08 = &local_b64;
                      local_b00 = *(undefined8 *)(lVar31 + 0x18);
                      local_af8 = (Intersectors *)local_a98;
                      local_ae8 = &local_b38;
                      local_ae0 = 1;
                      context = (RayQueryContext *)This;
                      local_af0 = This;
                      if (((*(code **)(lVar31 + 0x48) == (code *)0x0) ||
                          ((**(code **)(lVar31 + 0x48))(&local_b08), *local_b08 != 0)) &&
                         ((*(code **)(pbVar11 + 0x10) == (code *)0x0 ||
                          ((((*pbVar11 & 2) == 0 && ((*(byte *)(lVar31 + 0x3e) & 0x40) == 0)) ||
                           ((**(code **)(pbVar11 + 0x10))(&local_b08), *local_b08 != 0))))))
                      goto LAB_0022d069;
                      *(undefined4 *)&(This->intersector1).intersect = local_aa8._0_4_;
                      uVar39 = uVar39 ^ 1L << ((ulong)local_b58 & 0x3f);
                      uVar28 = 0;
                      if (uVar39 != 0) {
                        for (; (uVar39 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                        }
                      }
                      local_b58 = (Intersectors *)uVar28;
                    } while (uVar39 != 0);
                    local_988 = *(float *)&This->ptr;
                    local_998 = *(float *)((long)&This->ptr + 4);
                    local_aa8._4_4_ = *(undefined4 *)&This->leafIntersector;
                    local_a98._0_4_ = *(float *)&(This->collider).collide;
                    local_9a8 = *(float *)((long)&(This->collider).collide + 4);
                    local_b58._0_4_ = *(float *)&(This->collider).name;
                    fStack_984 = local_988;
                    fStack_980 = local_988;
                    fStack_97c = local_988;
                    fStack_994 = local_998;
                    fStack_990 = local_998;
                    fStack_98c = local_998;
                    local_aa8._0_4_ = local_aa8._4_4_;
                    fStack_aa0 = (float)local_aa8._4_4_;
                    fStack_a9c = (float)local_aa8._4_4_;
                    local_a98._4_4_ = (float)local_a98;
                    fStack_a90 = (float)local_a98;
                    fStack_a8c = (float)local_a98;
                    fStack_9a4 = local_9a8;
                    fStack_9a0 = local_9a8;
                    fStack_99c = local_9a8;
                    local_b58._4_4_ = (float)local_b58;
                    fStack_b50 = (float)local_b58;
                    fStack_b4c = (float)local_b58;
                    auVar81 = local_a78._0_12_;
                  }
                }
              }
              fVar113 = fStack_a60;
              fVar87 = fStack_a64;
              fVar80 = local_a68;
              fStack_b50 = local_b58._4_4_;
              uVar26 = local_ad8._0_4_;
              uVar30 = local_ad8._4_4_;
              fVar109 = fStack_ad0;
              fVar112 = auVar81._4_4_;
              fVar116 = auVar81._0_4_;
              fVar115 = auVar81._8_4_;
              local_ad8._0_4_ = (float)local_ad8._0_4_ - (float)local_818;
              local_ad8._4_4_ = local_a68 - local_818._4_4_;
              fStack_ad0 = fVar116 - fStack_810;
              fStack_acc = local_7f8 - fStack_80c;
              fVar129 = (float)uVar30 - local_808;
              fVar138 = fStack_a64 - fStack_804;
              fVar46 = fVar112 - fStack_800;
              fStack_a5c = fStack_7f4 - fStack_7fc;
              local_a58 = fVar109 - local_a58;
              fStack_a54 = fStack_a60 - fStack_a54;
              fStack_a50 = fVar115 - fStack_a50;
              fStack_a4c = fStack_7f0 - fStack_a4c;
              fVar55 = (float)local_a88 - (float)uVar26;
              fVar59 = local_a88._4_4_ - local_a68;
              fVar63 = fStack_a80 - fVar116;
              fVar71 = fStack_a7c - local_7f8;
              fVar130 = local_7e8 - (float)uVar30;
              fVar114 = fStack_7e4 - fStack_a64;
              fVar89 = fStack_7e0 - fVar112;
              fVar91 = fStack_7dc - fStack_7f4;
              fVar125 = (float)local_a48 - fVar109;
              fVar126 = local_a48._4_4_ - fStack_a60;
              fVar127 = fStack_a40 - fVar115;
              fVar131 = fStack_a3c - fStack_7f0;
              local_a68 = fVar129;
              fStack_a64 = fVar138;
              fStack_a60 = fVar46;
              local_8d8[0] = fVar130 * local_a58 - fVar125 * fVar129;
              local_8d8[1] = fVar114 * fStack_a54 - fVar126 * fVar138;
              local_8d8[2] = fVar89 * fStack_a50 - fVar127 * fVar46;
              local_8d8[3] = fVar91 * fStack_a4c - fVar131 * fStack_a5c;
              local_8c8._0_4_ = fVar125 * (float)local_ad8._0_4_ - fVar55 * local_a58;
              local_8c8._4_4_ = fVar126 * (float)local_ad8._4_4_ - fVar59 * fStack_a54;
              fStack_8c0 = fVar127 * fStack_ad0 - fVar63 * fStack_a50;
              fStack_8bc = fVar131 * fStack_acc - fVar71 * fStack_a4c;
              fVar98 = fVar55 * fVar129 - fVar130 * (float)local_ad8._0_4_;
              fVar100 = fVar59 * fVar138 - fVar114 * (float)local_ad8._4_4_;
              fStack_a80 = fVar63 * fVar46 - fVar89 * fStack_ad0;
              fStack_a7c = fVar71 * fStack_a5c - fVar91 * fStack_acc;
              fVar132 = (float)uVar26 - fStack_97c;
              fVar80 = fVar80 - fStack_97c;
              fStack_a40 = fVar116 - fStack_97c;
              fStack_a3c = local_7f8 - fStack_97c;
              fVar75 = (float)uVar30 - fStack_98c;
              fVar87 = fVar87 - fStack_98c;
              fVar112 = fVar112 - fStack_98c;
              fVar77 = fStack_7f4 - fStack_98c;
              fVar109 = fVar109 - (float)local_aa8._0_4_;
              fVar113 = fVar113 - (float)local_aa8._4_4_;
              fVar115 = fVar115 - fStack_aa0;
              fVar92 = fStack_7f0 - fStack_a9c;
              fVar117 = fVar75 * local_b58._4_4_ - fVar109 * fStack_99c;
              fVar128 = fVar87 * local_b58._4_4_ - fVar113 * fStack_99c;
              fVar53 = fVar112 * local_b58._4_4_ - fVar115 * fStack_99c;
              fVar57 = fVar77 * local_b58._4_4_ - fVar92 * fStack_99c;
              fVar61 = fVar109 * local_a98._4_4_ - fVar132 * local_b58._4_4_;
              fVar118 = fVar113 * local_a98._4_4_ - fVar80 * local_b58._4_4_;
              fVar119 = fVar115 * local_a98._4_4_ - fStack_a40 * local_b58._4_4_;
              fVar124 = fVar92 * local_a98._4_4_ - fStack_a3c * local_b58._4_4_;
              local_a48 = CONCAT44(fVar80,fVar132);
              fVar133 = fVar132 * fStack_99c - fVar75 * local_a98._4_4_;
              fVar134 = fVar80 * fStack_99c - fVar87 * local_a98._4_4_;
              fVar44 = fStack_a40 * fStack_99c - fVar112 * local_a98._4_4_;
              fVar51 = fStack_a3c * fStack_99c - fVar77 * local_a98._4_4_;
              local_a88 = CONCAT44(fVar100,fVar98);
              fVar116 = local_a98._4_4_ * local_8d8[0] +
                        fStack_99c * (float)local_8c8._0_4_ + local_b58._4_4_ * fVar98;
              fVar104 = local_a98._4_4_ * local_8d8[1] +
                        fStack_99c * (float)local_8c8._4_4_ + local_b58._4_4_ * fVar100;
              fVar54 = local_a98._4_4_ * local_8d8[2] +
                       fStack_99c * fStack_8c0 + local_b58._4_4_ * fStack_a80;
              fVar58 = local_a98._4_4_ * local_8d8[3] +
                       fStack_99c * fStack_8bc + local_b58._4_4_ * fStack_a7c;
              uVar45 = (uint)fVar116 & 0x80000000;
              uVar52 = (uint)fVar104 & 0x80000000;
              uVar56 = (uint)fVar54 & 0x80000000;
              uVar60 = (uint)fVar58 & 0x80000000;
              fVar130 = (float)((uint)(fVar55 * fVar117 + fVar130 * fVar61 + fVar125 * fVar133) ^
                               uVar45);
              fVar114 = (float)((uint)(fVar59 * fVar128 + fVar114 * fVar118 + fVar126 * fVar134) ^
                               uVar52);
              fVar89 = (float)((uint)(fVar63 * fVar53 + fVar89 * fVar119 + fVar127 * fVar44) ^
                              uVar56);
              fVar91 = (float)((uint)(fVar71 * fVar57 + fVar91 * fVar124 + fVar131 * fVar51) ^
                              uVar60);
              auVar94._0_4_ =
                   (float)((uint)(fVar117 * (float)local_ad8._0_4_ +
                                 fVar61 * fVar129 + fVar133 * local_a58) ^ uVar45);
              auVar94._4_4_ =
                   (float)((uint)(fVar128 * (float)local_ad8._4_4_ +
                                 fVar118 * fVar138 + fVar134 * fStack_a54) ^ uVar52);
              auVar94._8_4_ =
                   (float)((uint)(fVar53 * fStack_ad0 + fVar119 * fVar46 + fVar44 * fStack_a50) ^
                          uVar56);
              auVar94._12_4_ =
                   (float)((uint)(fVar57 * fStack_acc + fVar124 * fStack_a5c + fVar51 * fStack_a4c)
                          ^ uVar60);
              fVar129 = ABS(fVar116);
              fVar138 = ABS(fVar104);
              local_938 = (undefined1  [8])(CONCAT44(fVar104,fVar116) & 0x7fffffff7fffffff);
              fStack_930 = ABS(fVar54);
              fStack_92c = ABS(fVar58);
              auVar107._0_4_ =
                   -(uint)((0.0 <= fVar130 && 0.0 <= auVar94._0_4_) && fVar116 != 0.0) &
                   local_978._0_4_ & -(uint)(fVar130 + auVar94._0_4_ <= fVar129);
              auVar107._4_4_ =
                   -(uint)((0.0 <= fVar114 && 0.0 <= auVar94._4_4_) && fVar104 != 0.0) &
                   local_978._4_4_ & -(uint)(fVar114 + auVar94._4_4_ <= fVar138);
              auVar107._8_4_ =
                   -(uint)((0.0 <= fVar89 && 0.0 <= auVar94._8_4_) && fVar54 != 0.0) &
                   local_978._8_4_ & -(uint)(fVar89 + auVar94._8_4_ <= fStack_930);
              auVar107._12_4_ =
                   -(uint)((0.0 <= fVar91 && 0.0 <= auVar94._12_4_) && fVar58 != 0.0) &
                   local_978._12_4_ & -(uint)(fVar91 + auVar94._12_4_ <= fStack_92c);
              iVar34 = movmskps((int)uVar28,auVar107);
              if (iVar34 != 0) {
                local_948 = (float)(uVar45 ^ (uint)(fVar132 * local_8d8[0] +
                                                   fVar75 * (float)local_8c8._0_4_ +
                                                   fVar109 * fVar98));
                fStack_944 = (float)(uVar52 ^ (uint)(fVar80 * local_8d8[1] +
                                                    fVar87 * (float)local_8c8._4_4_ +
                                                    fVar113 * fVar100));
                fStack_940 = (float)(uVar56 ^ (uint)(fStack_a40 * local_8d8[2] +
                                                    fVar112 * fStack_8c0 + fVar115 * fStack_a80));
                fStack_93c = (float)(uVar60 ^ (uint)(fStack_a3c * local_8d8[3] +
                                                    fVar77 * fStack_8bc + fVar92 * fStack_a7c));
                fVar109 = *(float *)((long)&This->leafIntersector + 4);
                local_ad8 = (undefined1  [8])(This->intersector1).intersect;
                unique0x00006c88 = (This->intersector1).occluded;
                fVar80 = SUB84(local_ad8,0);
                local_918._0_4_ =
                     -(uint)(local_948 <= fVar80 * fVar129 && fVar109 * fVar129 < local_948) &
                     auVar107._0_4_;
                local_918._4_4_ =
                     -(uint)(fStack_944 <= fVar80 * fVar138 && fVar109 * fVar138 < fStack_944) &
                     auVar107._4_4_;
                local_918._8_4_ =
                     -(uint)(fStack_940 <= fVar80 * fStack_930 && fVar109 * fStack_930 < fStack_940)
                     & auVar107._8_4_;
                local_918._12_4_ =
                     -(uint)(fStack_93c <= fVar80 * fStack_92c && fVar109 * fStack_92c < fStack_93c)
                     & auVar107._12_4_;
                uVar45 = movmskps(iVar34,local_918);
                if (uVar45 != 0) {
                  context = (RayQueryContext *)extractps(_local_ad8,1);
                  local_8b8 = local_a88;
                  uStack_8b0 = CONCAT44(fStack_a7c,fStack_a80);
                  auVar108._0_4_ = fVar129 - auVar94._0_4_;
                  auVar108._4_4_ = fVar138 - auVar94._4_4_;
                  auVar108._8_4_ = fStack_930 - auVar94._8_4_;
                  auVar108._12_4_ = fStack_92c - auVar94._12_4_;
                  auVar97._4_12_ = auVar94._4_12_;
                  auVar97._0_4_ = (float)(int)(*(ushort *)(local_ab8 + 8 + lVar33) - 1);
                  auVar122._4_4_ = auVar94._4_4_;
                  auVar122._0_4_ = auVar97._0_4_;
                  auVar122._8_4_ = auVar94._8_4_;
                  auVar122._12_4_ = auVar94._12_4_;
                  auVar47 = rcpss(auVar122,auVar97);
                  fVar80 = (float)(int)(*(ushort *)(local_ab8 + 10 + lVar33) - 1);
                  fVar109 = (2.0 - auVar97._0_4_ * auVar47._0_4_) * auVar47._0_4_;
                  auVar123._4_4_ = local_8d8[1];
                  auVar123._0_4_ = fVar80;
                  auVar123._8_4_ = local_8d8[2];
                  auVar123._12_4_ = local_8d8[3];
                  auVar23._4_4_ = local_8d8[1];
                  auVar23._0_4_ = fVar80;
                  auVar23._8_4_ = local_8d8[2];
                  auVar23._12_4_ = local_8d8[3];
                  auVar47 = rcpss(auVar123,auVar23);
                  fVar80 = (2.0 - fVar80 * auVar47._0_4_) * auVar47._0_4_;
                  local_968._0_4_ =
                       fVar109 * ((float)(int)local_828._0_4_ * fVar129 + (fVar129 - fVar130));
                  local_968._4_4_ =
                       fVar109 * ((float)(local_828._0_4_ + 1) * fVar138 + (fVar138 - fVar114));
                  fStack_960 = fVar109 * ((float)(local_828._0_4_ + 1) * fStack_930 +
                                         (fStack_930 - fVar89));
                  fStack_95c = fVar109 * ((float)(int)local_828._0_4_ * fStack_92c +
                                         (fStack_92c - fVar91));
                  local_958._0_4_ =
                       fVar80 * ((float)(int)local_838._0_4_ * fVar129 + auVar108._0_4_);
                  local_958._4_4_ =
                       fVar80 * ((float)(int)local_838._0_4_ * fVar138 + auVar108._4_4_);
                  fStack_950 = fVar80 * ((float)(local_838._0_4_ + 1) * fStack_930 + auVar108._8_4_)
                  ;
                  fStack_94c = fVar80 * ((float)(local_838._0_4_ + 1) * fStack_92c + auVar108._12_4_
                                        );
                  lVar31 = *(long *)(*(long *)(local_ab0 + 0x1e8) + local_b40 * 8);
                  if ((*(uint *)(lVar31 + 0x34) & (uint)context) != 0) {
                    pbVar11 = *(byte **)&(local_b60->dir).field_0;
                    if ((*(long *)(pbVar11 + 0x10) == 0) && (*(long *)(lVar31 + 0x48) == 0)) {
LAB_0022d069:
                      *(undefined4 *)&(This->intersector1).intersect = 0xff800000;
                      return;
                    }
                    auVar47 = rcpps(auVar108,_local_938);
                    fVar109 = auVar47._0_4_;
                    fVar80 = auVar47._4_4_;
                    fVar87 = auVar47._8_4_;
                    fVar113 = auVar47._12_4_;
                    fVar109 = (1.0 - fVar129 * fVar109) * fVar109 + fVar109;
                    fVar80 = (1.0 - fVar138 * fVar80) * fVar80 + fVar80;
                    fVar87 = (1.0 - fStack_930 * fVar87) * fVar87 + fVar87;
                    fVar113 = (1.0 - fStack_92c * fVar113) * fVar113 + fVar113;
                    local_8e8[0] = local_948 * fVar109;
                    local_8e8[1] = fStack_944 * fVar80;
                    local_8e8[2] = fStack_940 * fVar87;
                    local_8e8[3] = fStack_93c * fVar113;
                    local_908[0] = (float)local_968._0_4_ * fVar109;
                    local_908[1] = (float)local_968._4_4_ * fVar80;
                    local_908[2] = fStack_960 * fVar87;
                    local_908[3] = fStack_95c * fVar113;
                    local_8f8[0] = (float)local_958._0_4_ * fVar109;
                    local_8f8[1] = (float)local_958._4_4_ * fVar80;
                    local_8f8[2] = fStack_950 * fVar87;
                    local_8f8[3] = fStack_94c * fVar113;
                    uVar39 = (ulong)(uVar45 & 0xff);
                    uVar28 = 0;
                    if (uVar39 != 0) {
                      for (; ((uVar45 & 0xff) >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                      }
                    }
                    local_b58 = *(Intersectors **)((long)&(local_b60->org).field_0 + 8);
                    fStack_b4c = fStack_b50;
                    fStack_a90 = local_a98._4_4_;
                    fStack_a8c = local_a98._4_4_;
                    local_9a8 = fStack_99c;
                    fStack_9a4 = fStack_99c;
                    fStack_9a0 = fStack_99c;
                    local_998 = fStack_98c;
                    fStack_994 = fStack_98c;
                    fStack_990 = fStack_98c;
                    local_988 = fStack_97c;
                    fStack_984 = fStack_97c;
                    fStack_980 = fStack_97c;
                    local_a98._0_4_ = local_a98._4_4_;
                    do {
                      local_b2c = local_908[uVar28];
                      local_b28 = local_8f8[uVar28];
                      *(float *)&(This->intersector1).intersect = local_8e8[uVar28];
                      local_b38 = local_8d8[uVar28];
                      local_b34 = *(undefined4 *)(local_8c8 + uVar28 * 4);
                      local_b30 = *(undefined4 *)((long)&local_8b8 + uVar28 * 4);
                      local_b24 = (undefined4)local_ac0;
                      local_b20 = (undefined4)local_b40;
                      local_b1c = *(undefined4 *)&local_b58->ptr;
                      local_b18 = *(undefined4 *)((long)&local_b58->ptr + 4);
                      local_b64 = -1;
                      local_b08 = &local_b64;
                      local_b00 = *(undefined8 *)(lVar31 + 0x18);
                      local_af8 = local_b58;
                      local_ae8 = &local_b38;
                      local_ae0 = 1;
                      context = (RayQueryContext *)local_b58;
                      local_af0 = This;
                      if (((*(code **)(lVar31 + 0x48) == (code *)0x0) ||
                          ((**(code **)(lVar31 + 0x48))(&local_b08), *local_b08 != 0)) &&
                         ((*(code **)(pbVar11 + 0x10) == (code *)0x0 ||
                          ((((*pbVar11 & 2) == 0 && ((*(byte *)(lVar31 + 0x3e) & 0x40) == 0)) ||
                           ((**(code **)(pbVar11 + 0x10))(&local_b08), *local_b08 != 0))))))
                      goto LAB_0022d069;
                      *(int *)&(This->intersector1).intersect = local_ad8._0_4_;
                      uVar39 = uVar39 ^ 1L << (uVar28 & 0x3f);
                      uVar28 = 0;
                      if (uVar39 != 0) {
                        for (; (uVar39 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                        }
                      }
                    } while (uVar39 != 0);
                  }
                }
              }
              uVar32 = uVar32 & uVar32 - 1;
            } while (uVar32 != 0);
          }
          local_9c8 = local_9c8 + 1;
          fVar109 = local_848;
          fVar129 = fStack_844;
          fVar138 = fStack_840;
          fVar104 = fStack_83c;
          fVar116 = local_868;
          fVar46 = fStack_864;
          fVar54 = fStack_860;
          fVar58 = fStack_85c;
          fVar130 = local_878;
          fVar112 = fStack_874;
          fVar114 = fStack_870;
          fVar115 = fStack_86c;
          fVar80 = local_888;
          fVar89 = fStack_884;
          fVar91 = fStack_880;
          fVar117 = fStack_87c;
          fVar128 = local_8a8;
          fVar53 = fStack_8a4;
          fVar57 = fStack_8a0;
          fVar61 = fStack_89c;
          fVar113 = local_858;
          fVar126 = fStack_854;
          fVar127 = fStack_850;
          fVar131 = fStack_84c;
          fVar87 = local_898;
          fVar132 = fStack_894;
          fVar133 = fStack_890;
          fVar134 = fStack_88c;
        } while (local_9c8 != local_9d0);
      }
      uVar32 = local_a28;
      uVar28 = local_a10;
      uVar39 = local_a18;
      uVar36 = local_a20;
      uVar38 = local_a30;
      uVar40 = local_a38;
      fVar118 = local_9b8;
      fVar119 = fStack_9b4;
      fVar124 = fStack_9b0;
      fVar125 = fStack_9ac;
    } while (local_a08 != &local_7d8);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }